

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  int iVar1;
  cname *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  __s2 = p->next;
  pcVar5 = p->end;
  bVar8 = __s2 < pcVar5;
  if (bVar8) {
    lVar7 = 0;
    iVar6 = 0;
    pcVar3 = __s2;
    do {
      pcVar4 = pcVar3 + 1;
      if (((pcVar4 < pcVar5) && (*pcVar3 == endc)) && (*pcVar4 == ']')) {
        if (bVar8) {
          pcVar5 = "NUL";
          pcVar2 = cnames;
          do {
            pcVar2 = pcVar2 + 1;
            iVar1 = strncmp(pcVar5,__s2,lVar7 >> 0x20);
            if ((iVar1 == 0) && (pcVar5[lVar7 >> 0x20] == '\0')) {
              return pcVar2[-1].code;
            }
            pcVar5 = pcVar2->name;
          } while (pcVar5 != (char *)0x0);
          if (iVar6 == -1) {
            return *__s2;
          }
          if (p->error == 0) {
            p->error = 3;
          }
          goto LAB_00106c4f;
        }
        break;
      }
      p->next = pcVar4;
      iVar6 = iVar6 + -1;
      lVar7 = lVar7 + 0x100000000;
      bVar8 = pcVar4 < pcVar5;
      pcVar3 = pcVar4;
    } while (pcVar4 != pcVar5);
  }
  if (p->error == 0) {
    p->error = 7;
  }
LAB_00106c4f:
  p->next = nuls;
  p->end = nuls;
  return '\0';
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
register struct parse *p;
int endc;			/* name ended by endc,']' */
{
	register char *sp = p->next;
	register struct cname *cp;
	register int len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		SETERROR(REG_EBRACK);
		return(0);
	}
	len = (int) (p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	SETERROR(REG_ECOLLATE);			/* neither */
	return(0);
}